

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O2

bool __thiscall XmlModelSerialiser::saveModel(XmlModelSerialiser *this,QString *destination)

{
  XmlModelSerialiserPrivate *this_00;
  bool bVar1;
  QXmlStreamWriter writer;
  QXmlStreamWriter aQStack_18 [8];
  
  if ((destination == (QString *)0x0) ||
     (this_00 = (XmlModelSerialiserPrivate *)
                (this->super_AbstractStringSerialiser).super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
     m_constModel == (QAbstractItemModel *)0x0)) {
    bVar1 = false;
  }
  else {
    QXmlStreamWriter::QXmlStreamWriter(aQStack_18,destination);
    bVar1 = XmlModelSerialiserPrivate::writeXml(this_00,aQStack_18);
    QXmlStreamWriter::~QXmlStreamWriter(aQStack_18);
  }
  return bVar1;
}

Assistant:

bool XmlModelSerialiser::saveModel(QString *destination) const
{
    if (!destination)
        return false;
    Q_D(const XmlModelSerialiser);

    if (!d->m_constModel)
        return false;
    QXmlStreamWriter writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeXml(writer);
}